

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::Generate(cmGlobalNinjaGenerator *this)

{
  char *lhss;
  cmake *this_00;
  cmGeneratedFileStream *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  string sStack_1c8;
  cmListFileBacktrace local_1a8;
  ostringstream msg;
  
  lhss = (this->NinjaVersion)._M_dataplus._M_p;
  RequiredNinjaVersion_abi_cxx11_();
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,lhss,_msg);
  std::__cxx11::string::~string((string *)&msg);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar4 = std::operator<<((ostream *)&msg,"The detected version of Ninja (");
    std::operator<<(poVar4,(string *)&this->NinjaVersion);
    std::operator<<((ostream *)&msg,") is less than the version of Ninja required by CMake (");
    RequiredNinjaVersion_abi_cxx11_();
    poVar4 = std::operator<<((ostream *)&msg,(string *)&sStack_1c8);
    std::operator<<(poVar4,").");
    std::__cxx11::string::~string((string *)&sStack_1c8);
    this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
    std::__cxx11::stringbuf::str();
    local_1a8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1a8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmake::IssueMessage(this_00,FATAL_ERROR,&sStack_1c8,&local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1a8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&sStack_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  else {
    bVar2 = OpenBuildFileStream(this);
    if (bVar2) {
      bVar2 = OpenRulesFileStream(this);
      if (bVar2) {
        std::
        _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::clear(&(this->TargetDependsClosures)._M_t);
        InitOutputPathPrefix(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_1c8,"all",(allocator<char> *)&local_1a8);
        NinjaOutputPath((string *)&msg,this,&sStack_1c8);
        std::__cxx11::string::operator=((string *)&this->TargetAll,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::~string((string *)&sStack_1c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_1c8,"CMakeCache.txt",(allocator<char> *)&local_1a8);
        NinjaOutputPath((string *)&msg,this,&sStack_1c8);
        std::__cxx11::string::operator=((string *)&this->CMakeCacheFile,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::~string((string *)&sStack_1c8);
        PVar3 = cmMakefile::GetPolicyStatus
                          ((*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                             LocalGenerators.
                             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_start)->Makefile,CMP0058,false);
        this->PolicyCMP0058 = PVar3;
        this->ComputingUnknownDependencies = PVar3 < NEW;
        cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
        WriteAssumedSourceDependencies(this);
        WriteTargetAliases(this,(ostream *)
                                (this->BuildFileStream)._M_t.
                                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl)
        ;
        WriteFolderTargets(this,(ostream *)
                                (this->BuildFileStream)._M_t.
                                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl)
        ;
        WriteUnknownExplicitDependencies
                  (this,(ostream *)
                        (this->BuildFileStream)._M_t.
                        super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                        .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl);
        WriteBuiltinTargets(this,(ostream *)
                                 (this->BuildFileStream)._M_t.
                                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl
                           );
        bVar2 = cmSystemTools::GetErrorOccuredFlag();
        if (bVar2) {
          pcVar1 = (this->RulesFileStream)._M_t.
                   super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                   .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
          std::ios::setstate((int)pcVar1 +
                             (int)*(undefined8 *)
                                   (*(long *)&(pcVar1->super_ofstream).
                                              super_basic_ostream<char,_std::char_traits<char>_> +
                                   -0x18));
          pcVar1 = (this->BuildFileStream)._M_t.
                   super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                   .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
          std::ios::setstate((int)pcVar1 +
                             (int)*(undefined8 *)
                                   (*(long *)&(pcVar1->super_ofstream).
                                              super_basic_ostream<char,_std::char_traits<char>_> +
                                   -0x18));
        }
        CloseCompileCommandsStream(this);
        CloseRulesFileStream(this);
        CloseBuildFileStream(this);
      }
    }
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::Generate()
{
  // Check minimum Ninja version.
  if (cmSystemTools::VersionCompare(cmSystemTools::OP_LESS,
                                    this->NinjaVersion.c_str(),
                                    RequiredNinjaVersion().c_str())) {
    std::ostringstream msg;
    msg << "The detected version of Ninja (" << this->NinjaVersion;
    msg << ") is less than the version of Ninja required by CMake (";
    msg << cmGlobalNinjaGenerator::RequiredNinjaVersion() << ").";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                           msg.str());
    return;
  }
  if (!this->OpenBuildFileStream()) {
    return;
  }
  if (!this->OpenRulesFileStream()) {
    return;
  }

  this->TargetDependsClosures.clear();

  this->InitOutputPathPrefix();
  this->TargetAll = this->NinjaOutputPath("all");
  this->CMakeCacheFile = this->NinjaOutputPath("CMakeCache.txt");

  this->PolicyCMP0058 =
    this->LocalGenerators[0]->GetMakefile()->GetPolicyStatus(
      cmPolicies::CMP0058);
  this->ComputingUnknownDependencies =
    (this->PolicyCMP0058 == cmPolicies::OLD ||
     this->PolicyCMP0058 == cmPolicies::WARN);

  this->cmGlobalGenerator::Generate();

  this->WriteAssumedSourceDependencies();
  this->WriteTargetAliases(*this->BuildFileStream);
  this->WriteFolderTargets(*this->BuildFileStream);
  this->WriteUnknownExplicitDependencies(*this->BuildFileStream);
  this->WriteBuiltinTargets(*this->BuildFileStream);

  if (cmSystemTools::GetErrorOccuredFlag()) {
    this->RulesFileStream->setstate(std::ios::failbit);
    this->BuildFileStream->setstate(std::ios::failbit);
  }

  this->CloseCompileCommandsStream();
  this->CloseRulesFileStream();
  this->CloseBuildFileStream();
}